

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

string * gvr::(anonymous_namespace)::PLYProperty::type2Name_abi_cxx11_(ply_type type)

{
  undefined4 in_ESI;
  string *in_RDI;
  allocator local_24;
  allocator local_23;
  allocator local_22;
  allocator local_21;
  allocator local_20;
  allocator local_1f;
  allocator local_1e;
  allocator local_1d [16];
  allocator local_d [13];
  
  switch(in_ESI) {
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"int8",local_d);
    std::allocator<char>::~allocator((allocator<char> *)local_d);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"uint8",local_1d);
    std::allocator<char>::~allocator((allocator<char> *)local_1d);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"int16",&local_1e);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"uint16",&local_1f);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"int32",&local_20);
    std::allocator<char>::~allocator((allocator<char> *)&local_20);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"uint32",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"float32",&local_22);
    std::allocator<char>::~allocator((allocator<char> *)&local_22);
    break;
  case 8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"float64",&local_23);
    std::allocator<char>::~allocator((allocator<char> *)&local_23);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"none",&local_24);
    std::allocator<char>::~allocator((allocator<char> *)&local_24);
  }
  return in_RDI;
}

Assistant:

std::string PLYProperty::type2Name(ply_type type)
{
  switch (type)
  {
    case ply_int8:
      return "int8";

    case ply_uint8:
      return "uint8";

    case ply_int16:
      return "int16";

    case ply_uint16:
      return "uint16";

    case ply_int32:
      return "int32";

    case ply_uint32:
      return "uint32";

    case ply_float32:
      return "float32";

    case ply_float64:
      return "float64";

    default:
      break;
  }

  assert(false);

  return "none";
}